

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ErrorTest_ErrorComparison_DefaultErrorsEqualToEachOther_Test::TestBody
          (ErrorTest_ErrorComparison_DefaultErrorsEqualToEachOther_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  Error rhs;
  Error lhs;
  ErrorTest_ErrorComparison_DefaultErrorsEqualToEachOther_Test *this_local;
  
  Error::Error((Error *)((long)&rhs.mMessage.field_2 + 8));
  Error::Error((Error *)local_60);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_80,"lhs","rhs",(Error *)((long)&rhs.mMessage.field_2 + 8),
             (Error *)local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  Error::~Error((Error *)local_60);
  Error::~Error((Error *)((long)&rhs.mMessage.field_2 + 8));
  return;
}

Assistant:

TEST(ErrorTest, ErrorComparison_DefaultErrorsEqualToEachOther)
{
    Error lhs;
    Error rhs;

    EXPECT_EQ(lhs, rhs);
}